

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectest-interp.cc
# Opt level: O0

Result __thiscall
spectest::CommandRunner::OnAssertExceptionCommand
          (CommandRunner *this,AssertExceptionCommand *command)

{
  bool bVar1;
  Trap *this_00;
  bool local_91;
  string local_88;
  undefined1 local_68 [8];
  ActionResult result;
  AssertExceptionCommand *command_local;
  CommandRunner *this_local;
  
  result.trap.root_index_ = (Index)command;
  RunAction((ActionResult *)local_68,this,
            (command->super_CommandMixin<(wabt::CommandType)11>).super_Command.line,&command->action
            ,Quiet);
  bVar1 = wabt::interp::RefPtr::operator_cast_to_bool
                    ((RefPtr *)
                     &result.values.
                      super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage);
  local_91 = true;
  if (bVar1) {
    this_00 = wabt::interp::RefPtr<wabt::interp::Trap>::operator->
                        ((RefPtr<wabt::interp::Trap> *)
                         &result.values.
                          super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
    wabt::interp::Trap::message_abi_cxx11_(&local_88,this_00);
    local_91 = std::operator!=(&local_88,"uncaught exception");
    std::__cxx11::string::~string((string *)&local_88);
  }
  if (local_91 == false) {
    PrintError(this,*(uint32_t *)(result.trap.root_index_ + 0xc),"assert_exception passed");
    wabt::Result::Result((Result *)((long)&this_local + 4),Ok);
  }
  else {
    PrintError(this,*(uint32_t *)(result.trap.root_index_ + 0xc),
               "expected an exception to be thrown");
    wabt::Result::Result((Result *)((long)&this_local + 4),Error);
  }
  ActionResult::~ActionResult((ActionResult *)local_68);
  return (Result)this_local._4_4_;
}

Assistant:

wabt::Result CommandRunner::OnAssertExceptionCommand(
    const AssertExceptionCommand* command) {
  ActionResult result =
      RunAction(command->line, &command->action, RunVerbosity::Quiet);
  if (!result.trap || result.trap->message() != "uncaught exception") {
    PrintError(command->line, "expected an exception to be thrown");
    return wabt::Result::Error;
  }
  PrintError(command->line, "assert_exception passed");

  return wabt::Result::Ok;
}